

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall
iu_AssertionTest_x_iutest_x_STRNOTIN_Test::Body(iu_AssertionTest_x_iutest_x_STRNOTIN_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  char test [5];
  char *null;
  string str;
  allocator<char> local_229;
  AssertionResult local_228;
  char local_200 [4];
  undefined1 local_1fc;
  AssertionHelper local_1f8;
  char local_1c8 [8];
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [392];
  
  local_1fc = 0;
  builtin_strncpy(local_200,"test",4);
  local_1c8[0] = '\0';
  local_1c8[1] = '\0';
  local_1c8[2] = '\0';
  local_1c8[3] = '\0';
  local_1c8[4] = '\0';
  local_1c8[5] = '\0';
  local_1c8[6] = '\0';
  local_1c8[7] = '\0';
  local_1c0[0] = local_1b0;
  sVar2 = strlen(local_200);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,&local_200,local_200 + sVar2);
  iuutil::StrNotInHelper::Assertion<char[4],char[5]>
            (&local_228,(StrNotInHelper *)"\"Tes\"","test","Tes",&local_200,(char (*) [5])in_R9);
  if (local_228.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
    local_1f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x14f;
    local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.m_message._M_dataplus._M_p == &local_228.m_message.field_2) goto LAB_0013b06d;
  }
  else {
    paVar1 = &local_228.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_228.m_message._M_dataplus._M_p,
                      local_228.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::StrNotInHelper::Assertion<char[4],char[5]>
              (&local_228,(StrNotInHelper *)"\"Tes\"","test","Tes",&local_200,(char (*) [5])in_R9);
    if (local_228.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x150;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_228.m_message._M_dataplus._M_p,
                      local_228.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::StrNotInHelper::Assertion<char[4],char[5]>
              (&local_228,(StrNotInHelper *)"\"Tes\"","test","Tes",&local_200,(char (*) [5])in_R9);
    if (local_228.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x151;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_228.m_message._M_dataplus._M_p,
                      local_228.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::StrNotInHelper::Assertion<char[4],char[5]>
              (&local_228,(StrNotInHelper *)"\"Tes\"","test","Tes",&local_200,(char (*) [5])in_R9);
    if (local_228.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
      local_1f8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
      ;
      local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x152;
      local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
LAB_0013b220:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_228.m_message._M_dataplus._M_p,
                        local_228.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrNotInHelper::Assertion<char[4],std::__cxx11::string>
                (&local_228,(StrNotInHelper *)"\"Tes\"","str","Tes",(char (*) [4])local_1c0,in_R9);
      if (local_228.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
        local_1f8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x154;
        local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 2;
        iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
        goto LAB_0013b220;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_228.m_message._M_dataplus._M_p,
                        local_228.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrNotInHelper::Assertion<char[4],std::__cxx11::string>
                (&local_228,(StrNotInHelper *)"\"Tes\"","str","Tes",(char (*) [4])local_1c0,in_R9);
      if (local_228.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
        local_1f8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x155;
        local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_228.m_message._M_dataplus._M_p,
                        local_228.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrNotInHelper::Assertion<char[4],std::__cxx11::string>
                (&local_228,(StrNotInHelper *)"\"Tes\"","str","Tes",(char (*) [4])local_1c0,in_R9);
      if (local_228.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
        local_1f8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x156;
        local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
        iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_228.m_message._M_dataplus._M_p,
                        local_228.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrNotInHelper::Assertion<char[4],std::__cxx11::string>
                (&local_228,(StrNotInHelper *)"\"Tes\"","str","Tes",(char (*) [4])local_1c0,in_R9);
      if (local_228.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
        local_1f8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x157;
        local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
        iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
        goto LAB_0013b220;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_228.m_message._M_dataplus._M_p,
                        local_228.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrNotInHelper::Assertion<char_const*,char[5]>
                (&local_228,(StrNotInHelper *)"null","test",local_1c8,(char **)local_200,
                 (char (*) [5])in_R9);
      if (local_228.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
        local_1f8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x159;
        local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 2;
        iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
        goto LAB_0013b220;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_228.m_message._M_dataplus._M_p,
                        local_228.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrNotInHelper::Assertion<char_const*,char[5]>
                (&local_228,(StrNotInHelper *)"null","test",local_1c8,(char **)local_200,
                 (char (*) [5])in_R9);
      if (local_228.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
        local_1f8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x15a;
        local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_228.m_message._M_dataplus._M_p,
                        local_228.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrNotInHelper::Assertion<char_const*,char[5]>
                (&local_228,(StrNotInHelper *)"null","test",local_1c8,(char **)local_200,
                 (char (*) [5])in_R9);
      if (local_228.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
        local_1f8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x15b;
        local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
        iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_228.m_message._M_dataplus._M_p,
                        local_228.m_message.field_2._M_allocated_capacity + 1);
      }
      iuutil::StrNotInHelper::Assertion<char_const*,char[5]>
                (&local_228,(StrNotInHelper *)"null","test",local_1c8,(char **)local_200,
                 (char (*) [5])in_R9);
      if (local_228.m_result == false) {
        memset((iu_global_format_stringstream *)local_1a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,local_228.m_message._M_dataplus._M_p,&local_229);
        local_1f8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
        ;
        local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x15c;
        local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
        iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
        goto LAB_0013b220;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.m_message._M_dataplus._M_p == paVar1) goto LAB_0013b06d;
  }
  operator_delete(local_228.m_message._M_dataplus._M_p,
                  local_228.m_message.field_2._M_allocated_capacity + 1);
LAB_0013b06d:
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return;
}

Assistant:

IUTEST(AssertionTest, STRNOTIN)
{
    const char test[] = "test";
    const char* null = NULL;
    ::std::string str = test;
    IUTEST_ASSERT_STRNOTIN("Tes", test);
    IUTEST_EXPECT_STRNOTIN("Tes", test);
    IUTEST_INFORM_STRNOTIN("Tes", test);
    IUTEST_ASSUME_STRNOTIN("Tes", test);

    IUTEST_ASSERT_STRNOTIN("Tes", str);
    IUTEST_EXPECT_STRNOTIN("Tes", str);
    IUTEST_INFORM_STRNOTIN("Tes", str);
    IUTEST_ASSUME_STRNOTIN("Tes", str);

    IUTEST_ASSERT_STRNOTIN(null, test);
    IUTEST_EXPECT_STRNOTIN(null, test);
    IUTEST_INFORM_STRNOTIN(null, test);
    IUTEST_ASSUME_STRNOTIN(null, test);
}